

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.cpp
# Opt level: O2

char * crnlib::pixel_format_helpers::get_pixel_format_string(pixel_format fmt)

{
  if (fmt == PIXEL_FMT_INVALID) {
    return "INVALID";
  }
  if (fmt == PIXEL_FMT_ETC1) {
    return "ETC1";
  }
  if (fmt == PIXEL_FMT_DXT5A) {
    return "DXT5A";
  }
  if (fmt == PIXEL_FMT_L8) {
    return "L8";
  }
  if (fmt == PIXEL_FMT_ETC2) {
    return "ETC2";
  }
  if (fmt == PIXEL_FMT_3DC) {
    return "3DC";
  }
  if (fmt == PIXEL_FMT_DXT2) {
    return "DXT2";
  }
  if (fmt == PIXEL_FMT_DXT3) {
    return "DXT3";
  }
  if (fmt == PIXEL_FMT_DXT4) {
    return "DXT4";
  }
  if (fmt == PIXEL_FMT_DXT5) {
    return "DXT5";
  }
  if (fmt == PIXEL_FMT_DXT1A) {
    return "DXT1A";
  }
  if (fmt == PIXEL_FMT_ETC2A) {
    return "ETC2A";
  }
  if (fmt == PIXEL_FMT_A8R8G8B8) {
    return "A8R8G8B8";
  }
  if (fmt == PIXEL_FMT_A8L8) {
    return "A8L8";
  }
  if (fmt == PIXEL_FMT_A8) {
    return "A8";
  }
  if (fmt != PIXEL_FMT_DXT5_AGBR) {
    if (fmt == PIXEL_FMT_DXT5_xGBR) {
      return "DXT5_xGBR";
    }
    if (fmt == PIXEL_FMT_DXT5_xGxR) {
      return "DXT5_xGxR";
    }
    if (fmt == PIXEL_FMT_ETC1S) {
      return "ETC1S";
    }
    if (fmt == PIXEL_FMT_ETC2AS) {
      return "ETC2AS";
    }
    if (fmt == PIXEL_FMT_DXN) {
      return "DXN";
    }
    if (fmt == PIXEL_FMT_DXT5_CCxY) {
      return "DXT5_CCxY";
    }
    if (fmt == PIXEL_FMT_R8G8B8) {
      return "R8G8B8";
    }
    if (fmt == PIXEL_FMT_DXT1) {
      return "DXT1";
    }
    return "?";
  }
  return "DXT5_AGBR";
}

Assistant:

const char* get_pixel_format_string(pixel_format fmt) {
  switch (fmt) {
    case PIXEL_FMT_INVALID:
      return "INVALID";
    case PIXEL_FMT_DXT1:
      return "DXT1";
    case PIXEL_FMT_DXT1A:
      return "DXT1A";
    case PIXEL_FMT_DXT2:
      return "DXT2";
    case PIXEL_FMT_DXT3:
      return "DXT3";
    case PIXEL_FMT_DXT4:
      return "DXT4";
    case PIXEL_FMT_DXT5:
      return "DXT5";
    case PIXEL_FMT_3DC:
      return "3DC";
    case PIXEL_FMT_DXN:
      return "DXN";
    case PIXEL_FMT_DXT5A:
      return "DXT5A";
    case PIXEL_FMT_DXT5_CCxY:
      return "DXT5_CCxY";
    case PIXEL_FMT_DXT5_xGxR:
      return "DXT5_xGxR";
    case PIXEL_FMT_DXT5_xGBR:
      return "DXT5_xGBR";
    case PIXEL_FMT_DXT5_AGBR:
      return "DXT5_AGBR";
    case PIXEL_FMT_ETC1:
      return "ETC1";
    case PIXEL_FMT_ETC2:
      return "ETC2";
    case PIXEL_FMT_ETC2A:
      return "ETC2A";
    case PIXEL_FMT_ETC1S:
      return "ETC1S";
    case PIXEL_FMT_ETC2AS:
      return "ETC2AS";
    case PIXEL_FMT_R8G8B8:
      return "R8G8B8";
    case PIXEL_FMT_A8R8G8B8:
      return "A8R8G8B8";
    case PIXEL_FMT_A8:
      return "A8";
    case PIXEL_FMT_L8:
      return "L8";
    case PIXEL_FMT_A8L8:
      return "A8L8";
    default:
      break;
  }
  CRNLIB_ASSERT(false);
  return "?";
}